

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMInfo.cpp
# Opt level: O0

ROMImage * MT32Emu::ROMImage::makeFullROMImage(Bit8u *data,size_t dataSize)

{
  ROMImage *this;
  ArrayFile *this_00;
  ROMInfo **romInfos;
  size_t dataSize_local;
  Bit8u *data_local;
  
  this = (ROMImage *)operator_new(0x18);
  this_00 = (ArrayFile *)operator_new(0x50);
  ArrayFile::ArrayFile(this_00,data,dataSize);
  romInfos = getKnownROMInfoList();
  ROMImage(this,(File *)this_00,true,romInfos);
  return this;
}

Assistant:

const ROMImage *ROMImage::makeFullROMImage(Bit8u *data, size_t dataSize) {
	return new ROMImage(new ArrayFile(data, dataSize), true, getKnownROMInfoList());
}